

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O2

bool __thiscall
ON_V5x_DimStyle::OverrideFields(ON_V5x_DimStyle *this,ON_V5x_DimStyle *src,ON_V5x_DimStyle *parent)

{
  bool bVar1;
  arrow_type type;
  wchar_t *s;
  uint i;
  long lVar2;
  ON_V5x_DimStyle *pOVar3;
  ON_wString *this_00;
  ON_Arrowhead *pOVar4;
  uint uVar5;
  ON_UUID id;
  
  lVar2 = 0;
  uVar5 = 0;
  do {
    if (lVar2 == 0x58) {
      this->m_field_override_count = uVar5;
      return true;
    }
    if (src->m_field_override_count == 0) {
      this->m_field_override[lVar2] = false;
      pOVar3 = parent;
    }
    else {
      bVar1 = src->m_field_override[lVar2];
      this->m_field_override[lVar2] = bVar1;
      pOVar3 = src;
      if (bVar1 == 0) {
        pOVar3 = parent;
      }
      uVar5 = uVar5 + bVar1;
    }
    if (pOVar3 == this) goto switchD_004cf7ac_caseD_20;
    switch((int)lVar2) {
    case 2:
      this->m_extextension = pOVar3->m_extextension;
      break;
    case 3:
      this->m_extoffset = pOVar3->m_extoffset;
      break;
    case 4:
      this->m_arrowsize = pOVar3->m_arrowsize;
      break;
    case 5:
      this->m_centermark = pOVar3->m_centermark;
      break;
    case 6:
      if (0.0 <= pOVar3->m_textgap) {
        this->m_textgap = pOVar3->m_textgap;
      }
      break;
    case 7:
      SetTextHeight(this,pOVar3->m_textheight);
      break;
    case 8:
      this->m_dimstyle_textalign = pOVar3->m_dimstyle_textalign;
      break;
    case 9:
      this->m_arrowtype = pOVar3->m_arrowtype;
      break;
    case 10:
      this->m_angularunits = pOVar3->m_angularunits;
      break;
    case 0xb:
      this->m_lengthformat = pOVar3->m_lengthformat;
      break;
    case 0xc:
      this->m_angleformat = pOVar3->m_angleformat;
      break;
    case 0xd:
      if ((uint)pOVar3->m_angleresolution < 0x10) {
        this->m_angleresolution = pOVar3->m_angleresolution;
      }
      break;
    case 0xe:
      if ((uint)pOVar3->m_lengthresolution < 0x10) {
        this->m_lengthresolution = pOVar3->m_lengthresolution;
      }
      break;
    case 0xf:
      ON_TextStyle::operator=(&this->m_v5_text_style,&pOVar3->m_v5_text_style);
      break;
    case 0x10:
      this->m_lengthfactor = pOVar3->m_lengthfactor;
      break;
    case 0x11:
      this->m_bAlternate = pOVar3->m_bAlternate;
      break;
    case 0x12:
      this->m_alternate_lengthfactor = pOVar3->m_alternate_lengthfactor;
      break;
    case 0x13:
      this->m_alternate_lengthformat = pOVar3->m_alternate_lengthformat;
      break;
    case 0x14:
      this->m_alternate_lengthresolution = pOVar3->m_alternate_lengthresolution;
      break;
    case 0x15:
      this->m_alternate_angleformat = pOVar3->m_alternate_angleformat;
      break;
    case 0x16:
      this->m_alternate_angleresolution = pOVar3->m_alternate_angleresolution;
      break;
    case 0x17:
      s = ON_wString::operator_cast_to_wchar_t_(&pOVar3->m_prefix);
      this_00 = &this->m_prefix;
      goto LAB_004cfa17;
    case 0x18:
      s = ON_wString::operator_cast_to_wchar_t_(&pOVar3->m_suffix);
      this_00 = &this->m_suffix;
      goto LAB_004cfa17;
    case 0x19:
      s = ON_wString::operator_cast_to_wchar_t_(&pOVar3->m_alternate_prefix);
      this_00 = &this->m_alternate_prefix;
      goto LAB_004cfa17;
    case 0x1a:
      s = ON_wString::operator_cast_to_wchar_t_(&pOVar3->m_alternate_suffix);
      this_00 = &this->m_alternate_suffix;
LAB_004cfa17:
      ON_wString::operator=(this_00,s);
      break;
    case 0x1b:
      this->m_dimextension = pOVar3->m_dimextension;
      break;
    case 0x1c:
      this->m_leaderarrowsize = pOVar3->m_leaderarrowsize;
      break;
    case 0x1d:
      this->m_leaderarrowtype = pOVar3->m_leaderarrowtype;
      break;
    case 0x1e:
      this->m_bSuppressExtension1 = pOVar3->m_bSuppressExtension1;
      break;
    case 0x1f:
      this->m_bSuppressExtension2 = pOVar3->m_bSuppressExtension2;
      break;
    case 0x36:
      if ((uint)pOVar3->m_tolerance_style < 5) {
        this->m_tolerance_style = pOVar3->m_tolerance_style;
      }
      break;
    case 0x37:
      if ((uint)pOVar3->m_tolerance_resolution < 0x10) {
        this->m_tolerance_resolution = pOVar3->m_tolerance_resolution;
      }
      break;
    case 0x38:
      SetToleranceUpperValue(this,pOVar3->m_tolerance_upper_value);
      break;
    case 0x39:
      SetToleranceLowerValue(this,pOVar3->m_tolerance_lower_value);
      break;
    case 0x3a:
    case 0x46:
      SetToleranceHeightScale(this,pOVar3->m_tolerance_height_scale);
      break;
    case 0x3b:
      SetBaselineSpacing(this,pOVar3->m_baseline_spacing);
      break;
    case 0x3c:
      this->m_bDrawMask = pOVar3->m_bDrawMask;
      break;
    case 0x3d:
      this->m_mask_color_source = (uint)(pOVar3->m_mask_color_source == 1);
      break;
    case 0x3e:
      (this->m_mask_color).field_0 = (pOVar3->m_mask_color).field_0;
      break;
    case 0x40:
      SetDimScale(this,pOVar3->m_dimscale);
      break;
    case 0x41:
      this->m_dimscale_source = pOVar3->m_dimscale_source;
      break;
    case 0x42:
      this->m_fixed_extension_len = pOVar3->m_fixed_extension_len;
      break;
    case 0x43:
      this->m_fixed_extension_len_on = pOVar3->m_fixed_extension_len_on;
      break;
    case 0x44:
      this->m_text_rotation = pOVar3->m_text_rotation;
      break;
    case 0x45:
      this->m_alt_tol_resolution = pOVar3->m_alt_tol_resolution;
      break;
    case 0x47:
      this->m_suppress_arrow1 = pOVar3->m_suppress_arrow1;
      break;
    case 0x48:
      this->m_suppress_arrow2 = pOVar3->m_suppress_arrow2;
      break;
    case 0x49:
      this->m_textmove_leader = pOVar3->m_textmove_leader;
      break;
    case 0x4a:
      this->m_arclength_sym = pOVar3->m_arclength_sym;
      break;
    case 0x4b:
      this->m_stack_textheight_fraction = pOVar3->m_stack_textheight_fraction;
      break;
    case 0x4c:
      if ((uint)pOVar3->m_stack_format < 3) {
        this->m_stack_format = pOVar3->m_stack_format;
      }
      break;
    case 0x4d:
      this->m_alt_round = pOVar3->m_alt_round;
      break;
    case 0x4e:
      this->m_round = pOVar3->m_round;
      break;
    case 0x4f:
      this->m_alt_zero_suppress = pOVar3->m_alt_zero_suppress;
      break;
    case 0x50:
      this->m_tol_zero_suppress = pOVar3->m_tol_zero_suppress;
      break;
    case 0x51:
      this->m_ang_zero_suppress = pOVar3->m_ang_zero_suppress;
      break;
    case 0x52:
      this->m_zero_suppress = pOVar3->m_zero_suppress;
      break;
    case 0x53:
      this->m_alt_below = pOVar3->m_alt_below;
      break;
    case 0x54:
      type = ON_Arrowhead::ArrowheadType(&pOVar3->m_arrow_1);
      pOVar4 = &this->m_arrow_1;
      goto LAB_004cfcc7;
    case 0x55:
      type = ON_Arrowhead::ArrowheadType(&pOVar3->m_arrow_2);
      pOVar4 = &this->m_arrow_2;
LAB_004cfcc7:
      ON_Arrowhead::SetArrowheadType(pOVar4,type);
      break;
    case 0x56:
      id = ON_Arrowhead::ArrowBlockId(&pOVar3->m_arrow_1);
      pOVar4 = &this->m_arrow_1;
      goto LAB_004cfcaa;
    case 0x57:
      id = ON_Arrowhead::ArrowBlockId(&pOVar3->m_arrow_2);
      pOVar4 = &this->m_arrow_2;
LAB_004cfcaa:
      ON_Arrowhead::SetArrowBlockId(pOVar4,id);
    }
switchD_004cf7ac_caseD_20:
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

bool ON_V5x_DimStyle::OverrideFields(const ON_V5x_DimStyle& src, const ON_V5x_DimStyle& parent)
{
  // NOTE WELL:
  //  "this" could be src or parent, so do not modify member values until they are not longer needed.

  const unsigned int count = (unsigned int)(sizeof(m_field_override)/sizeof(m_field_override[0]));

  unsigned int field_override_count = 0;

  for(unsigned int i = 0; i < count; i++)
  {
    const bool bFromSrc = (src.m_field_override_count > 0 && src.m_field_override[i]);
    m_field_override[i] = bFromSrc;
    if ( bFromSrc )
      field_override_count++;
    const ON_V5x_DimStyle* copyfrom = bFromSrc ? (&src) : (&parent);

    if ( this == copyfrom )
      continue;

    switch((Field)i)
    {
    case Field::fn_extextension:
      SetExtExtension(copyfrom->ExtExtension());
      break;
    case Field::fn_extoffset:
      SetExtOffset(copyfrom->ExtOffset());
      break;
    case Field::fn_arrowsize:
      SetArrowSize(copyfrom->ArrowSize());
      break;
    case Field::fn_centermark:
      SetCenterMark(copyfrom->CenterMark());
      break;
    case Field::fn_textgap:
      SetTextGap(copyfrom->TextGap());
      break;
    case Field::fn_textheight:
      SetTextHeight(copyfrom->TextHeight());
      break;
    case Field::fn_textalign:
      SetTextAlignment(copyfrom->TextAlignment());
      break;
    case Field::fn_arrowtype:
      SetArrowType((eArrowType)copyfrom->ArrowType());
      break;
    case Field::fn_angularunits:
      SetAngularUnits((eArrowType)copyfrom->AngularUnits());
      break;
    case Field::fn_lengthformat:
      SetLengthFormat(copyfrom->LengthFormat());
      break;
    case Field::fn_angleformat:
      SetAngleFormat(copyfrom->AngleFormat());
      break;
    case Field::fn_angleresolution:
      SetAngleResolution(copyfrom->AngleResolution());
      break;
    case Field::fn_lengthresolution:
      SetLengthResolution(copyfrom->LengthResolution());
      break;
    case Field::fn_fontindex:
      SetV5TextStyle(copyfrom->V5TextStyle());
      break;
    case Field::fn_lengthfactor:
      SetLengthFactor(copyfrom->LengthFactor());
      break;
    case Field::fn_bAlternate:
      SetAlternate(copyfrom->Alternate());
      break;
    case Field::fn_alternate_lengthfactor:
      SetAlternateLengthFactor(copyfrom->AlternateLengthFactor());
      break;
    case Field::fn_alternate_lengthformat:
      SetAlternateLengthFormat(copyfrom->AlternateLengthFormat());
      break;
    case Field::fn_alternate_lengthresolution:
      SetAlternateLengthResolution(copyfrom->AlternateLengthResolution());
      break;
    case Field::fn_alternate_angleformat:
      SetAlternateAngleFormat(copyfrom->AlternateAngleFormat());
      break;
    case Field::fn_alternate_angleresolution:
      SetAlternateAngleResolution(copyfrom->AlternateAngleResolution());
      break;
    case Field::fn_prefix:
      SetPrefix(copyfrom->Prefix());
      break;
    case Field::fn_suffix:
      SetSuffix(copyfrom->Suffix());
      break;
    case Field::fn_alternate_prefix:
      SetAlternatePrefix(copyfrom->AlternatePrefix());
      break;
    case Field::fn_alternate_suffix:
      SetAlternateSuffix(copyfrom->AlternateSuffix());
      break;
    case Field::fn_dimextension:
      SetDimExtension(copyfrom->DimExtension());
      break;
    case Field::fn_leaderarrowsize:
      SetLeaderArrowSize(copyfrom->LeaderArrowSize());
      break;
    case Field::fn_leaderarrowtype:
      SetLeaderArrowType((eArrowType)copyfrom->LeaderArrowType());
      break;
    case Field::fn_suppressextension1:
      SetSuppressExtension1(copyfrom->SuppressExtension1());
      break;
    case Field::fn_suppressextension2:
      SetSuppressExtension2(copyfrom->SuppressExtension2());
      break;
    case Field::fn_tolerance_style:
      SetToleranceStyle(copyfrom->ToleranceStyle());
      break;
    case Field::fn_tolerance_resolution:
      SetToleranceResolution(copyfrom->ToleranceResolution());
      break;
    case Field::fn_tolerance_upper_value:
      SetToleranceUpperValue(copyfrom->ToleranceUpperValue());
      break;
    case Field::fn_tolerance_lower_value:
      SetToleranceLowerValue(copyfrom->ToleranceLowerValue());
      break;
    case Field::fn_tolerance_height_scale:
      SetToleranceHeightScale(copyfrom->ToleranceHeightScale());
      break;
    case Field::fn_baseline_spacing:
      SetBaselineSpacing(copyfrom->BaselineSpacing());
      break;
    case Field::fn_draw_mask:
      SetDrawTextMask(copyfrom->DrawTextMask());
      break;
    case Field::fn_mask_color_source:
      SetMaskColorSource(copyfrom->MaskColorSource());
      break;
    case Field::fn_mask_color:
      SetMaskColor(copyfrom->MaskColor());
      break;
    case Field::fn_dimscale:
      SetDimScale(copyfrom->DimScale());
      break;
    case Field::fn_dimscale_source:
      SetDimScaleSource(copyfrom->DimScaleSource());
      break;

    case Field::fn_fixed_extension_len:
      SetFixedExtensionLen(copyfrom->FixedExtensionLen());
      break;
    case Field::fn_fixed_extension_on:
      SetFixedExtensionLenOn(copyfrom->FixedExtensionLenOn());
      break;
    case Field::fn_text_rotation:
      SetTextRotation(copyfrom->TextRotation());
      break;
    case Field::fn_tolerance_alt_resolution:
      SetAlternateToleranceResolution(copyfrom->AlternateToleranceResolution());
      break;
    case Field::fn_tolerance_textheight_fraction:
      SetToleranceHeightScale(copyfrom->ToleranceHeightScale());
      break;
    case Field::fn_suppress_arrow1:
      SetSuppressArrow1(copyfrom->SuppressArrow1());
      break;
    case Field::fn_suppress_arrow2:
      SetSuppressArrow2(copyfrom->SuppressArrow2());
      break;
    case Field::fn_textmove_leader:
      SetTextMoveLeader(copyfrom->TextMoveLeader());
      break;
    case Field::fn_arclength_sym:
      SetArcLengthSymbol(copyfrom->ArcLengthSymbol());
      break;
    case Field::fn_stack_textheight_fraction:
      SetStackHeightFraction(copyfrom->StackHeightFraction());
      break;
    case Field::fn_stack_format:
      SetStackFractionFormat(copyfrom->StackFractionFormat());
      break;
    case Field::fn_alt_round:
      SetAlternateRoundOff(copyfrom->AlternateRoundOff());
      break;
    case Field::fn_round:
      SetRoundOff(copyfrom->RoundOff());
      break;
    case Field::fn_alt_zero_suppress:
      SetAlternateZeroSuppress(copyfrom->AlternateZeroSuppress());
      break;
    case Field::fn_tol_zero_suppress:
      SetToleranceZeroSuppress(copyfrom->ToleranceZeroSuppress());
      break;
    case Field::fn_ang_zero_suppress:
      SetAngleZeroSuppress(copyfrom->AngleZeroSuppress());
      break;
    case Field::fn_zero_suppress:
      SetZeroSuppress(copyfrom->ZeroSuppress());
      break;
    case Field::fn_alt_below:
      SetAlternateBelow(copyfrom->AlternateBelow());
      break;
    case Field::fn_dim_arrow_type1:
      SetArrowType1(copyfrom->ArrowType1());
      break;
    case Field::fn_dim_arrow_type2:
      SetArrowType2(copyfrom->ArrowType2());
      break;
    case Field::fn_dim_arrow_blockname1:
      SetArrowBlockId1(copyfrom->ArrowBlockId1());
      break;
    case Field::fn_dim_arrow_blockname2:
      SetArrowBlockId2(copyfrom->ArrowBlockId2());
      break;
    default:
      break;
    }
  }

  m_field_override_count = field_override_count;

  return true;
}